

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastzip.cpp
# Opt level: O1

PackResult
store_uncompressed(File *f,int inSize,uint8_t *out,size_t *outSize,uint32_t *checksum,uint8_t *sha)

{
  uint uVar1;
  PackResult PVar2;
  size_t len;
  undefined1 local_98 [8];
  SHA_CTX context;
  size_t sVar3;
  
  len = fread(out,1,(long)inSize,(FILE *)f->fp_);
  sVar3 = len;
  if (sha != (uint8_t *)0x0) {
    context._88_8_ = outSize;
    SHA1_Init((SHA_CTX *)local_98);
    SHA1_Update((SHA_CTX *)local_98,out,len);
    outSize = (size_t *)context._88_8_;
    uVar1 = SHA1_Final(sha,(SHA_CTX *)local_98);
    sVar3 = (size_t)uVar1;
  }
  PVar2 = (PackResult)sVar3;
  if (checksum != (uint32_t *)0x0) {
    PVar2 = crc32_fast(out,len,0);
    *checksum = PVar2;
  }
  *outSize = len;
  return PVar2;
}

Assistant:

static PackResult store_uncompressed(File& f, int inSize, uint8_t* out,
                                     size_t* outSize, uint32_t* checksum,
                                     uint8_t* sha)
{
    auto const size = f.Read(out, inSize);

    if (sha) {
        SHA_CTX context;
        SHA1_Init(&context);
        SHA1_Update(&context, out, size);
        SHA1_Final(sha, &context);
    }

    if (checksum) {
        *checksum = crc32_fast(out, size);
    }
    *outSize = size;

    return PackResult::STORED;
}